

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

DictionaryValue_KeyValuePair *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::MILSpec::DictionaryValue_KeyValuePair>(Arena *arena)

{
  DictionaryValue_KeyValuePair *this;
  
  if (arena == (Arena *)0x0) {
    this = (DictionaryValue_KeyValuePair *)operator_new(0x28);
    CoreML::Specification::MILSpec::DictionaryValue_KeyValuePair::DictionaryValue_KeyValuePair
              (this,(Arena *)0x0,false);
  }
  else {
    this = (DictionaryValue_KeyValuePair *)
           AllocateAlignedWithHook
                     (arena,0x28,
                      (type_info *)
                      &CoreML::Specification::MILSpec::DictionaryValue_KeyValuePair::typeinfo);
    CoreML::Specification::MILSpec::DictionaryValue_KeyValuePair::DictionaryValue_KeyValuePair
              (this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }